

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O3

void __thiscall TcpServer::printEvent(TcpServer *this,int fd,uint32_t events)

{
  long *plVar1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  char *__s;
  size_t sVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  key_type local_34 [2];
  int fd_local;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***********************************************",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"fd: ",4);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,fd);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  p_Var2 = (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var7 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var7->_M_header;
    do {
      if (fd <= (int)p_Var2[1]._M_color) {
        p_Var6 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < fd];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var7) && ((int)p_Var6[1]._M_color <= fd)) {
      pmVar3 = std::
               map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
               ::operator[](&this->connections,local_34);
      __s = inet_ntoa((in_addr)(pmVar3->address).sin_addr.s_addr);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1111e8);
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," : ",3);
      std::
      map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
      ::operator[](&this->connections,local_34);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  if ((events & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLIN",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  if ((events & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLPRI",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  if ((events & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLOUT",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  if ((events & 0x40) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLRDNORM",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  if ((char)events < '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLRDBAND",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  if ((events >> 8 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLWRNORM",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  if ((events >> 9 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLWRBAND",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  if ((events >> 10 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLMSG",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  if ((events & 8) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLERR",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  if ((events & 0x10) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLHUP",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  if ((events >> 0xd & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLRDHUP",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  if ((events >> 0x1d & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLWAKEUP",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  if ((events >> 0x1e & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLONESHOT",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  if ((int)events < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EPOLLET",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***********************************************",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void printEvent(int fd, uint32_t events) {
    std::cout << "***********************************************" << std::endl;
    std::cout << "fd: " << fd << std::endl;
    if (connections.find(fd) != connections.cend()) {
      // 有可能是服务端套接字和通知管道套接字，就不能输出地址了
      std::cout << inet_ntoa(connections[fd].address.sin_addr) << " : "
                << ntohs(connections[fd].address.sin_port) << std::endl;
    }
    if (events & EPOLLIN) std::cout << "EPOLLIN" << std::endl;
    if (events & EPOLLPRI) std::cout << "EPOLLPRI" << std::endl;
    if (events & EPOLLOUT) std::cout << "EPOLLOUT" << std::endl;
    if (events & EPOLLRDNORM) std::cout << "EPOLLRDNORM" << std::endl;
    if (events & EPOLLRDBAND) std::cout << "EPOLLRDBAND" << std::endl;
    if (events & EPOLLWRNORM) std::cout << "EPOLLWRNORM" << std::endl;
    if (events & EPOLLWRBAND) std::cout << "EPOLLWRBAND" << std::endl;
    if (events & EPOLLMSG) std::cout << "EPOLLMSG" << std::endl;
    if (events & EPOLLERR) std::cout << "EPOLLERR" << std::endl;
    if (events & EPOLLHUP) std::cout << "EPOLLHUP" << std::endl;
    if (events & EPOLLRDHUP) std::cout << "EPOLLRDHUP" << std::endl;
    if (events & EPOLLWAKEUP) std::cout << "EPOLLWAKEUP" << std::endl;
    if (events & EPOLLONESHOT) std::cout << "EPOLLONESHOT" << std::endl;
    if (events & EPOLLET) std::cout << "EPOLLET" << std::endl;
    std::cout << "***********************************************" << std::endl;
  }